

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

bool __thiscall draco::ObjDecoder::ParseMaterial(ObjDecoder *this,Status *param_2)

{
  bool bVar1;
  int iVar2;
  DecoderBuffer *pDVar3;
  reference __s1;
  long lVar4;
  mapped_type *pmVar5;
  pointer ppVar6;
  ObjDecoder *in_RDI;
  iterator it;
  string mat_name;
  DecoderBuffer line_buffer;
  array<char,_6UL> c;
  key_type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  DecoderBuffer *in_stack_ffffffffffffff40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_ffffffffffffff68;
  string local_88 [106];
  array<char,_6UL> local_1e [4];
  byte local_1;
  
  if (((in_RDI->counting_mode_ & 1U) == 0) && (in_RDI->material_att_id_ < 0)) {
    local_1 = 0;
  }
  else {
    pDVar3 = buffer(in_RDI);
    bVar1 = DecoderBuffer::Peek<std::array<char,6ul>>(pDVar3,local_1e);
    if (bVar1) {
      __s1 = std::array<char,_6UL>::operator[]
                       ((array<char,_6UL> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (size_type)in_stack_ffffffffffffff28);
      iVar2 = memcmp(__s1,"usemtl",6);
      if (iVar2 == 0) {
        pDVar3 = buffer(in_RDI);
        DecoderBuffer::Advance(pDVar3,6);
        buffer(in_RDI);
        parser::ParseLineIntoDecoderBuffer((DecoderBuffer *)in_stack_ffffffffffffff68._M_cur);
        parser::SkipWhitespace
                  ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        std::__cxx11::string::string(local_88);
        parser::ParseLine(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        lVar4 = std::__cxx11::string::length();
        if (lVar4 == 0) {
          local_1 = 0;
        }
        else {
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_ffffffffffffff28,(key_type *)0x11d270);
          local_a0._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)in_stack_ffffffffffffff28);
          bVar1 = std::__detail::operator==
                            ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                              *)&stack0xffffffffffffff68,&local_a0);
          if (bVar1) {
            in_RDI->last_material_id_ = in_RDI->num_materials_;
            iVar2 = in_RDI->num_materials_;
            in_RDI->num_materials_ = iVar2 + 1;
            pmVar5 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)CONCAT44(iVar2,in_stack_ffffffffffffff30),
                                  in_stack_ffffffffffffff28);
            *pmVar5 = iVar2;
            local_1 = 1;
          }
          else {
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                   *)0x11d2ff);
            in_RDI->last_material_id_ = ppVar6->second;
            local_1 = 1;
          }
        }
        std::__cxx11::string::~string(local_88);
        DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x11d334);
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ObjDecoder::ParseMaterial(Status * /* status */) {
  // In second pass, skip when we don't use materials.
  if (!counting_mode_ && material_att_id_ < 0) {
    return false;
  }
  std::array<char, 6> c;
  if (!buffer()->Peek(&c)) {
    return false;
  }
  if (std::memcmp(&c[0], "usemtl", 6) != 0) {
    return false;
  }
  buffer()->Advance(6);
  DecoderBuffer line_buffer = parser::ParseLineIntoDecoderBuffer(buffer());
  parser::SkipWhitespace(&line_buffer);
  std::string mat_name;
  parser::ParseLine(&line_buffer, &mat_name);
  if (mat_name.length() == 0) {
    return false;
  }
  auto it = material_name_to_id_.find(mat_name);
  if (it == material_name_to_id_.end()) {
    // In first pass, materials found in obj that's not in the .mtl file
    // will be added to the list.
    last_material_id_ = num_materials_;
    material_name_to_id_[mat_name] = num_materials_++;

    return true;
  }
  last_material_id_ = it->second;
  return true;
}